

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void * lws_vhd_find_by_pvo(lws_context *cx,char *protname,char *pvo_name,char *pvo_value)

{
  int iVar1;
  lws_protocol_vhost_options *plVar2;
  lws_log_cx *cx_00;
  lws_protocol_vhost_options *pv;
  lws_vhost *plStack_38;
  int n;
  lws_vhost *vh;
  char *pvo_value_local;
  char *pvo_name_local;
  char *protname_local;
  lws_context *cx_local;
  
  plStack_38 = cx->vhost_list;
  do {
    if (plStack_38 == (lws_vhost *)0x0) {
      return (void *)0x0;
    }
    if (plStack_38->protocol_vh_privs == (void **)0x0) {
      cx_00 = lwsl_vhost_get_cx(plStack_38);
      _lws_log_cx(cx_00,lws_log_prepend_vhost,plStack_38,4,"lws_vhd_find_by_pvo","no privs yet");
    }
    else {
      for (pv._4_4_ = 0; pv._4_4_ < plStack_38->count_protocols; pv._4_4_ = pv._4_4_ + 1) {
        iVar1 = strcmp(plStack_38->protocols[pv._4_4_].name,protname);
        if ((((iVar1 == 0) &&
             (plVar2 = lws_pvo_search(plStack_38->pvo,protname),
             plVar2 != (lws_protocol_vhost_options *)0x0)) &&
            (plVar2 = lws_pvo_search(plVar2->options,pvo_name),
            plVar2 != (lws_protocol_vhost_options *)0x0)) &&
           (iVar1 = strcmp(plVar2->value,pvo_value), iVar1 == 0)) {
          return plStack_38->protocol_vh_privs[pv._4_4_];
        }
      }
    }
    plStack_38 = plStack_38->vhost_next;
  } while( true );
}

Assistant:

void *
lws_vhd_find_by_pvo(struct lws_context *cx, const char *protname,
		    const char *pvo_name, const char *pvo_value)
{
	struct lws_vhost *vh;
	int n;

	/* let's go through all the vhosts */

	vh = cx->vhost_list;
	while (vh) {

		if (vh->protocol_vh_privs) {

		for (n = 0; n < vh->count_protocols; n++) {
			const struct lws_protocol_vhost_options *pv;

			if (strcmp(vh->protocols[n].name, protname))
				continue;

			/* this vh has an instance of the required protocol */

			pv = lws_pvo_search(vh->pvo, protname);
			if (!pv)
				continue;

			pv = lws_pvo_search(pv->options, pvo_name);
			if (!pv)
				continue;

			/* ... he also has a pvo of the right name... */
			if (!strcmp(pv->value, pvo_value))
				/*
				 * ... yes, the pvo has the right value too,
				 * return a pointer to this vhost-protocol
				 * private alloc (ie, its "vhd")
				 */
				return vh->protocol_vh_privs[n];
		}
		} else
			lwsl_vhost_notice(vh, "no privs yet");
		vh = vh->vhost_next;
	}

	return NULL;
}